

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.h
# Opt level: O2

void __thiscall ctemplate::ValidateUrl::~ValidateUrl(ValidateUrl *this)

{
  operator_delete(this);
  return;
}

Assistant:

class CTEMPLATE_EXPORT ValidateUrl : public TemplateModifier {
 public:
  explicit ValidateUrl(const TemplateModifier& chained_modifier,
                       const char* unsafe_url_replacement)
      : chained_modifier_(chained_modifier),
        unsafe_url_replacement_(unsafe_url_replacement),
        unsafe_url_replacement_length_(strlen(unsafe_url_replacement)) { }
  MODIFY_SIGNATURE_;
  static const char* const kUnsafeUrlReplacement;
  static const char* const kUnsafeImgSrcUrlReplacement;
 private:
  const TemplateModifier& chained_modifier_;
  const char* unsafe_url_replacement_;
  int unsafe_url_replacement_length_;
}